

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef BinaryenAtomicFence(BinaryenModuleRef module)

{
  BinaryenExpressionRef pEVar1;
  
  pEVar1 = (BinaryenExpressionRef)MixedArena::allocSpace(&module->allocator,0x18,8);
  *(undefined8 *)pEVar1 = 0;
  (pEVar1->type).id = 0;
  *(undefined8 *)(pEVar1 + 1) = 0;
  pEVar1->_id = AtomicFenceId;
  return pEVar1;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicFence(BinaryenModuleRef module) {
  return static_cast<Expression*>(Builder(*(Module*)module).makeAtomicFence());
}